

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_encoder.h
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerTraversalValenceEncoder::Done(MeshEdgebreakerTraversalValenceEncoder *this)

{
  size_type sVar1;
  reference pvVar2;
  MeshEdgebreakerTraversalEncoder *in_RDI;
  int i;
  EncoderBuffer *in_stack_000000e0;
  Options *in_stack_000000e8;
  int in_stack_000000f0;
  int in_stack_000000f4;
  uint32_t *in_stack_000000f8;
  EncoderBuffer *in_stack_ffffffffffffffc8;
  MeshEdgebreakerTraversalEncoder *in_stack_ffffffffffffffd0;
  int local_c;
  
  MeshEdgebreakerTraversalEncoder::EncodeStartFaces((MeshEdgebreakerTraversalEncoder *)0x1a2178);
  MeshEdgebreakerTraversalEncoder::EncodeAttributeSeams(in_stack_ffffffffffffffd0);
  local_c = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::size((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)&in_RDI[1].traversal_buffer_.bit_encoder_);
    if (sVar1 <= (ulong)(long)local_c) break;
    pvVar2 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)&in_RDI[1].traversal_buffer_.bit_encoder_,(long)local_c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar2);
    MeshEdgebreakerTraversalEncoder::GetOutputBuffer(in_RDI);
    EncodeVarint<unsigned_int>((uint)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    pvVar2 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)&in_RDI[1].traversal_buffer_.bit_encoder_,(long)local_c);
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar2);
    if (sVar1 != 0) {
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)&in_RDI[1].traversal_buffer_.bit_encoder_,(long)local_c);
      in_stack_ffffffffffffffd0 =
           (MeshEdgebreakerTraversalEncoder *)
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1a2230);
      pvVar2 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)&in_RDI[1].traversal_buffer_.bit_encoder_,(long)local_c);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar2);
      MeshEdgebreakerTraversalEncoder::GetOutputBuffer(in_RDI);
      EncodeSymbols(in_stack_000000f8,in_stack_000000f4,in_stack_000000f0,in_stack_000000e8,
                    in_stack_000000e0);
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void Done() {
    // Store the init face configurations and attribute seam data
    MeshEdgebreakerTraversalEncoder::EncodeStartFaces();
    MeshEdgebreakerTraversalEncoder::EncodeAttributeSeams();

    // Store the contexts.
    for (int i = 0; i < context_symbols_.size(); ++i) {
      EncodeVarint<uint32_t>(static_cast<uint32_t>(context_symbols_[i].size()),
                             GetOutputBuffer());
      if (context_symbols_[i].size() > 0) {
        EncodeSymbols(context_symbols_[i].data(),
                      static_cast<int>(context_symbols_[i].size()), 1, nullptr,
                      GetOutputBuffer());
      }
    }
  }